

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

bool __thiscall
kj::Function<bool_(capnp::MessageBuilder_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1657:35)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1657:35)>
             *this,MessageBuilder *params)

{
  uint *puVar1;
  DebugExpression<bool> _kjCondition_1;
  Reader call;
  Reader message;
  Reader desc;
  Reader capTable;
  DebugComparison<unsigned_int,_int> _kjCondition;
  String local_290;
  StructReader local_278;
  Exception *local_248;
  CapTableReader *local_240;
  short *local_238;
  WirePointer *local_230;
  uint local_228;
  short local_224;
  undefined4 local_220;
  StructReader local_218;
  ListReader local_1e8;
  undefined1 local_1b8 [24];
  WirePointer *local_1a0;
  undefined1 local_198;
  undefined2 local_194;
  int local_190;
  
  capnp::MessageBuilder::getRootInternal((Builder *)&local_1e8,params);
  local_278.data = local_1e8.ptr;
  local_278.segment = local_1e8.segment;
  local_278.capTable = local_1e8.capTable;
  capnp::_::PointerBuilder::getStruct
            ((StructBuilder *)local_1b8,(PointerBuilder *)&local_278,(StructSize)0x10001,(word *)0x0
            );
  capnp::_::StructBuilder::asReader((StructBuilder *)local_1b8);
  if ((0xf < local_228) && (*local_238 == 2)) {
    if (local_224 == 0) {
      local_220 = 0x7fffffff;
      local_240 = (CapTableReader *)0x0;
      local_230 = (WirePointer *)0x0;
      local_248 = (Exception *)0x0;
    }
    local_1a0 = (WirePointer *)CONCAT44(local_1a0._4_4_,local_220);
    local_1b8._0_8_ = local_248;
    local_1b8._8_8_ = local_240;
    local_1b8._16_8_ = local_230;
    capnp::_::PointerReader::getStruct(&local_278,(PointerReader *)local_1b8,(word *)0x0);
    if (((0x7f < local_278.dataSize) && (*(long *)((long)local_278.data + 8) == -0x2238f40687becc31)
        ) && (*(short *)((long)local_278.data + 4) == 0)) {
      if (local_278.pointerCount < 2) {
        local_218.capTable = (CapTableReader *)0x0;
        local_218.data = (WirePointer *)0x0;
        local_218.segment = (SegmentReader *)0x0;
        local_278.nestingLimit = 0x7fffffff;
      }
      else {
        local_218.data = local_278.pointers + 1;
        local_218.capTable = local_278.capTable;
        local_218.segment = local_278.segment;
      }
      local_218.pointers._0_4_ = local_278.nestingLimit;
      capnp::_::PointerReader::getStruct
                ((StructReader *)local_1b8,(PointerReader *)&local_218,(word *)0x0);
      local_218.data = (WirePointer *)0x0;
      local_218.segment = (SegmentReader *)(Exception *)0x0;
      local_218.capTable = (CapTableReader *)0x0;
      local_218.pointers._0_4_ = 0x7fffffff;
      if (OVERLOADED < (ushort)local_194) {
        local_218.data = local_1a0 + 1;
        local_218.segment = (SegmentReader *)local_1b8._0_8_;
        local_218.capTable = (CapTableReader *)local_1b8._8_8_;
        local_218.pointers._0_4_ = local_190;
      }
      capnp::_::PointerReader::getList
                (&local_1e8,(PointerReader *)&local_218,INLINE_COMPOSITE,(word *)0x0);
      local_1b8._4_4_ = 1;
      local_1b8._8_8_ = " == ";
      local_1b8._16_8_ = &DAT_00000005;
      local_1a0 = (WirePointer *)CONCAT71(local_1a0._1_7_,local_1e8.elementCount == 1);
      if (local_1e8.elementCount == 1) {
        capnp::_::ListReader::getStructElement(&local_218,&local_1e8,0);
        if (local_218.dataSize < 0x10) {
          local_290.content.ptr._0_1_ = false;
        }
        else {
          local_290.content.ptr._0_1_ =
               (short)((WireValue<uint32_t>_conflict *)local_218.data)->value == 2;
          if (local_290.content.ptr._0_1_) {
            local_1b8._0_4_ = 0;
            if (0x3f < local_218.dataSize) {
              local_1b8._0_4_ =
                   ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_218.data + 4))->
                   upper32Bits;
            }
            local_1b8._8_8_ = (this->f).expectedExportNumber;
            local_198 = local_1b8._0_4_ ==
                        *(uint32_t *)
                         &((CapTableReader *)
                          &((CapTableReader *)local_1b8._8_8_)->_vptr_CapTableReader)->
                          _vptr_CapTableReader;
            local_1b8._16_8_ = " == ";
            local_1a0 = (WirePointer *)&DAT_00000005;
            if ((bool)local_198) {
              puVar1 = (this->f).interceptCount;
              *puVar1 = *puVar1 + 1;
              if (*(this->f).shouldThrowFromSend != true) {
                return true;
              }
              kj::_::Debug::makeDescription<char_const(&)[12]>
                        (&local_290,(Debug *)0x52d3cf,"intercepted",(char (*) [12])local_218.data);
              Exception::Exception
                        ((Exception *)local_1b8,FAILED,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                         ,0x689,&local_290);
              throwFatalException((Exception *)local_1b8,0);
            }
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int&>&>
                      ((Fault *)&local_290,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                       ,0x685,FAILED,"desc.getSenderPromise() == expectedExportNumber",
                       "_kjCondition,",(DebugComparison<unsigned_int,_unsigned_int_&> *)local_1b8);
            kj::_::Debug::Fault::fatal((Fault *)&local_290);
          }
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                  ((Fault *)local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                   ,0x684,FAILED,"desc.isSenderPromise()","_kjCondition,",
                   (DebugExpression<bool> *)&local_290);
        kj::_::Debug::Fault::fatal((Fault *)local_1b8);
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
                ((Fault *)&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x682,FAILED,"capTable.size() == 1","_kjCondition,",
                 (DebugComparison<unsigned_int,_int> *)local_1b8);
      kj::_::Debug::Fault::fatal((Fault *)&local_218);
    }
  }
  return true;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }